

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

char * Abc_SopCreateNand(Mem_Flex_t *pMan,int nVars)

{
  char *__s;
  
  __s = Abc_SopStart(pMan,1,nVars);
  if (0 < nVars) {
    memset(__s,0x31,(ulong)(uint)nVars);
  }
  __s[(long)nVars + 1] = '0';
  return __s;
}

Assistant:

char * Abc_SopCreateNand( Mem_Flex_t * pMan, int nVars )
{
    char * pSop;
    int i;
    pSop = Abc_SopStart( pMan, 1, nVars );
    for ( i = 0; i < nVars; i++ )
        pSop[i] = '1';
    pSop[nVars + 1] = '0';
    return pSop;
}